

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fits_translate_keywords
              (fitsfile *infptr,fitsfile *outfptr,int firstkey,char *(*patterns) [2],int npat,
              int n_value,int n_offset,int n_range,int *status)

{
  size_t sVar1;
  int in_EDX;
  undefined4 in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000038;
  char *in_stack_00000040;
  int nkeys1;
  int i1;
  char outrec [81];
  int ii;
  int maxchr;
  int pat_num;
  int m;
  int n;
  int j;
  int i;
  char rec [81];
  int nmore;
  int nkeys;
  int nrec;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  int *in_stack_fffffffffffffe90;
  fitsfile *in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  undefined6 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffece;
  undefined1 uVar2;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  char cVar3;
  undefined7 in_stack_fffffffffffffed9;
  int in_stack_fffffffffffffef0;
  int *in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  fitsfile *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff10;
  int *in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff20;
  int local_d4;
  int local_cc [4];
  fitsfile local_bc [6];
  int local_58;
  int local_54;
  int local_3c;
  int local_24;
  
  local_bc[0].HDUposition = 0;
  local_cc[3] = 0;
  local_cc[2] = 0;
  local_cc[1] = 0;
  local_cc[0] = 0;
  if (*in_stack_00000018 < 1) {
    local_3c = in_EDX;
    ffghsp(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
           (int *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),(int *)0x15c791);
    for (local_54 = local_3c; uVar2 = *in_stack_00000018 == 0 && local_54 <= local_58,
        *in_stack_00000018 == 0 && local_54 <= local_58; local_54 = local_54 + 1) {
      cVar3 = '\0';
      ffgrec(in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),(int *)0x15c7fd);
      sVar1 = strlen(&local_bc[0].field_0x4);
      for (local_d4 = 8; local_d4 < (int)sVar1; local_d4 = local_d4 + 1) {
        if (((char)(&local_bc[0].field_0x4)[local_d4] < ' ') ||
           ('~' < (char)(&local_bc[0].field_0x4)[local_d4])) {
          (&local_bc[0].field_0x4)[local_d4] = 0x20;
        }
      }
      in_stack_fffffffffffffe90 = local_cc;
      in_stack_fffffffffffffe98 = local_bc;
      in_stack_fffffffffffffe88 = in_stack_00000010;
      fits_translate_keyword
                ((char *)CONCAT71(in_stack_fffffffffffffed9,cVar3),
                 (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                 (char *(*) [2])
                 CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)),
                 in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                 (int)((ulong)in_stack_00000018 >> 0x20),in_stack_fffffffffffffef0,
                 in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,
                 &in_stack_ffffffffffffff08->HDUposition,in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
      if (*in_stack_00000018 == 0) {
        if (cVar3 == '-') {
          in_stack_fffffffffffffed4 = 8;
          while( true ) {
            in_stack_fffffffffffffece = false;
            if (1 < in_stack_fffffffffffffed4) {
              in_stack_fffffffffffffece =
                   (&stack0xfffffffffffffed8)[in_stack_fffffffffffffed4] == ' ';
            }
            if ((bool)in_stack_fffffffffffffece == false) break;
            (&stack0xfffffffffffffed8)[in_stack_fffffffffffffed4] = 0;
            in_stack_fffffffffffffed4 = in_stack_fffffffffffffed4 + -1;
          }
          ffpmrk();
          ffdkey(_nkeys1,in_stack_00000040,in_stack_00000038);
          if ((*in_stack_00000018 == 0) &&
             (ffghsp(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                     (int *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                     (int *)0x15c9c4), in_stack_fffffffffffffed0 != local_58)) {
            local_54 = local_54 + -1;
            local_58 = in_stack_fffffffffffffed0;
          }
          *in_stack_00000018 = 0;
          ffcmrk();
        }
        else if (cVar3 != '\0') {
          ffprec(in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00,
                 in_stack_fffffffffffffef8);
        }
      }
      local_bc[0].Fptr._4_1_ = 0;
    }
    local_24 = *in_stack_00000018;
  }
  else {
    local_24 = *in_stack_00000018;
  }
  return local_24;
}

Assistant:

int fits_translate_keywords(
	   fitsfile *infptr,   /* I - pointer to input HDU */
	   fitsfile *outfptr,  /* I - pointer to output HDU */
	   int firstkey,       /* I - first HDU record number to start with */
	   char *patterns[][2],/* I - pointer to input / output keyword templates */
	   int npat,           /* I - number of templates passed */
	   int n_value,        /* I - base 'n' template value of interest */
	   int n_offset,       /* I - offset to be applied to the 'n' */
 	                       /*     value in the output string */
	   int n_range,        /* I - controls range of 'n' template */
	                       /*     values of interest (-1,0, or +1) */
           int *status)        /* IO - error status */
/*
     Copy relevant keywords from the table header into the newly
     created primary array header.  Convert names of keywords where
     appropriate.  See fits_translate_keyword() for the definitions.

     Translation begins at header record number 'firstkey', and
     continues to the end of the header.

  This routine was written by Craig Markwardt, GSFC
*/
{
    int nrec, nkeys, nmore;
    char rec[FLEN_CARD];
    int i = 0, j = 0, n = 0, m = 0;
    int pat_num = 0, maxchr, ii;
    char outrec[FLEN_CARD];

    if (*status > 0)
        return(*status);

    ffghsp(infptr, &nkeys, &nmore, status);  /* get number of keywords */

    for (nrec = firstkey; (*status == 0) && (nrec <= nkeys); nrec++) {
      outrec[0] = '\0';

      ffgrec(infptr, nrec, rec, status);

      /* silently overlook any illegal ASCII characters in the value or */
      /* comment fields of the record. It is usually not appropriate to */
      /* abort the process because of this minor transgression of the FITS rules. */
      /* Set the offending character to a blank */

      maxchr = strlen(rec);
      for (ii = 8; ii < maxchr; ii++)
      {
        if (rec[ii] < 32 || rec[ii] > 126)
          rec[ii] = ' ';
      }
      
      fits_translate_keyword(rec, outrec, patterns, npat, 
			     n_value, n_offset, n_range, 
			     &pat_num, &i, &j, &m, &n, status);
      
      if (*status == 0) {
	if (outrec[0] == '-') { /* prefix -KEYNAME means delete */
	  int i1;

	  /* Preserve only the keyword portion of name */
	  outrec[9] = 0;
	  for(i1=8; i1>1 && outrec[i1] == ' '; i1--) outrec[i1] = 0;

	  ffpmrk();
	  ffdkey(outfptr, outrec+1, status); /* delete the keyword */
	  if (*status == 0) {
	    int nkeys1;
	    /* get number of keywords again in case of change*/
	    ffghsp(infptr, &nkeys1, &nmore, status);  
	    if (nkeys1 != nkeys) {
	      nrec --;
	      nkeys = nkeys1;
	    }
	  }
	  *status = 0;
	  ffcmrk();

	} else if (outrec[0]) {
	  ffprec(outfptr, outrec, status); /* copy the keyword */
	}	  
      }
      rec[8] = 0; outrec[8] = 0;

    }	

    return(*status);
}